

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

bool __thiscall
cmTarget::GetMappedConfig
          (cmTarget *this,string *desired_config,char **loc,char **imp,string *suffix)

{
  bool bVar1;
  size_t sVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  undefined7 extraout_var;
  char *pcVar4;
  string *s;
  pointer s_00;
  string mapProp;
  string locProp;
  string locPropBase;
  string impProp;
  string config_upper;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  mappedConfigs;
  string local_f8;
  char **local_d8;
  undefined4 local_cc;
  string local_c8;
  string local_a8;
  undefined1 local_88 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  undefined1 local_58;
  undefined7 uStack_57;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_68._M_allocated_capacity = (size_type)&local_58;
  local_68._8_8_ = 0;
  local_58 = 0;
  local_d8 = imp;
  if (desired_config->_M_string_length != 0) {
    cmsys::SystemTools::UpperCase(&local_a8,desired_config);
    std::__cxx11::string::operator=((string *)local_68._M_local_buf,(string *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,
                      CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                               local_a8.field_2._M_local_buf[0]) + 1);
    }
  }
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  if (this->TargetTypeValue == OBJECT_LIBRARY) {
    pcVar4 = "IMPORTED_OBJECTS";
  }
  else if (this->TargetTypeValue == INTERFACE_LIBRARY) {
    pcVar4 = "IMPORTED_LIBNAME";
  }
  else {
    pcVar4 = "IMPORTED_LOCATION";
  }
  std::__cxx11::string::_M_replace((ulong)&local_a8,0,(char *)0x0,(ulong)pcVar4);
  std::__cxx11::string::_M_replace((ulong)suffix,0,(char *)suffix->_M_string_length,0x4e2e07);
  std::__cxx11::string::_M_append((char *)suffix,local_68._M_allocated_capacity);
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"MAP_IMPORTED_CONFIG_","");
  std::__cxx11::string::_M_append((char *)&local_f8,local_68._M_allocated_capacity);
  pcVar4 = GetProperty(this,&local_f8);
  if (pcVar4 != (char *)0x0) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    sVar2 = strlen(pcVar4);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,pcVar4,pcVar4 + sVar2);
    cmSystemTools::ExpandListArgument(&local_c8,&local_48,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  paVar3 = &local_f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != paVar3) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    paVar3 = extraout_RAX;
  }
  if (this->DLLPlatform == true) {
    local_cc = (undefined4)CONCAT71((int7)((ulong)paVar3 >> 8),1);
    if (this->TargetTypeValue != SHARED_LIBRARY) {
      bVar1 = IsExecutableWithExports(this);
      local_cc = (undefined4)CONCAT71(extraout_var,bVar1);
    }
  }
  else {
    local_cc = 0;
  }
  bVar1 = *loc != (char *)0x0;
  if (((*loc == (char *)0x0) && (*local_d8 == (char *)0x0)) &&
     (local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    s_00 = local_48.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    do {
      if (s_00->_M_string_length == 0) {
        pcVar4 = GetProperty(this,&local_a8);
        *loc = pcVar4;
        if ((char)local_cc != '\0') {
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"IMPORTED_IMPLIB","");
          pcVar4 = GetProperty(this,&local_f8);
          *local_d8 = pcVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
          }
        }
        if ((*loc != (char *)0x0) || (*local_d8 != (char *)0x0)) {
          suffix->_M_string_length = 0;
          *(suffix->_M_dataplus)._M_p = '\0';
        }
      }
      else {
        cmsys::SystemTools::UpperCase(&local_f8,s_00);
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_c8,local_a8._M_dataplus._M_p,
                   local_a8._M_dataplus._M_p + local_a8._M_string_length);
        std::__cxx11::string::append((char *)&local_c8);
        std::__cxx11::string::_M_append((char *)&local_c8,(ulong)local_f8._M_dataplus._M_p);
        pcVar4 = GetProperty(this,&local_c8);
        *loc = pcVar4;
        if ((char)local_cc != '\0') {
          local_88._0_8_ = local_88 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"IMPORTED_IMPLIB_","");
          std::__cxx11::string::_M_append((char *)local_88,(ulong)local_f8._M_dataplus._M_p);
          pcVar4 = GetProperty(this,(string *)local_88);
          *local_d8 = pcVar4;
          if ((string *)local_88._0_8_ != (string *)(local_88 + 0x10)) {
            operator_delete((void *)local_88._0_8_,(ulong)(local_88._16_8_ + 1));
          }
        }
        if ((*loc != (char *)0x0) || (*local_d8 != (char *)0x0)) {
          std::__cxx11::string::_M_replace
                    ((ulong)suffix,0,(char *)suffix->_M_string_length,0x4e2e07);
          std::__cxx11::string::_M_append((char *)suffix,(ulong)local_f8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
      }
      bVar1 = *loc != (char *)0x0;
    } while (((!bVar1) && (*local_d8 == (char *)0x0)) &&
            (s_00 = s_00 + 1,
            s_00 != local_48.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish));
  }
  if (((bVar1) ||
      (local_48.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       local_48.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) || (*local_d8 != (char *)0x0)) {
    if ((!bVar1) && (*local_d8 == (char *)0x0)) {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_f8,local_a8._M_dataplus._M_p,
                 local_a8._M_dataplus._M_p + local_a8._M_string_length);
      std::__cxx11::string::_M_append((char *)&local_f8,(ulong)(suffix->_M_dataplus)._M_p);
      pcVar4 = GetProperty(this,&local_f8);
      *loc = pcVar4;
      if ((char)local_cc != '\0') {
        local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"IMPORTED_IMPLIB","");
        std::__cxx11::string::_M_append((char *)&local_c8,(ulong)(suffix->_M_dataplus)._M_p);
        pcVar4 = GetProperty(this,&local_c8);
        *local_d8 = pcVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
          operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
    }
    if ((*loc == (char *)0x0) && (*local_d8 == (char *)0x0)) {
      suffix->_M_string_length = 0;
      *(suffix->_M_dataplus)._M_p = '\0';
      pcVar4 = GetProperty(this,&local_a8);
      *loc = pcVar4;
      if ((char)local_cc != '\0') {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"IMPORTED_IMPLIB","");
        pcVar4 = GetProperty(this,&local_f8);
        *local_d8 = pcVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
      }
    }
    if ((*loc == (char *)0x0) && (*local_d8 == (char *)0x0)) {
      local_88._0_8_ = (string *)0x0;
      local_88._8_8_ = (string *)0x0;
      local_88._16_8_ = (pointer)0x0;
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f8,"IMPORTED_CONFIGURATIONS","");
      pcVar4 = GetProperty(this,&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (pcVar4 != (char *)0x0) {
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        sVar2 = strlen(pcVar4);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,pcVar4,pcVar4 + sVar2);
        cmSystemTools::ExpandListArgument
                  (&local_f8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_88,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar4 = *loc;
      for (s = (string *)local_88._0_8_;
          ((pcVar4 == (char *)0x0 && (*local_d8 == (char *)0x0)) && (s != (string *)local_88._8_8_))
          ; s = s + 1) {
        std::__cxx11::string::_M_replace((ulong)suffix,0,(char *)suffix->_M_string_length,0x4e2e07);
        cmsys::SystemTools::UpperCase(&local_f8,s);
        std::__cxx11::string::_M_append((char *)suffix,(ulong)local_f8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_f8,local_a8._M_dataplus._M_p,
                   local_a8._M_dataplus._M_p + local_a8._M_string_length);
        std::__cxx11::string::_M_append((char *)&local_f8,(ulong)(suffix->_M_dataplus)._M_p);
        pcVar4 = GetProperty(this,&local_f8);
        *loc = pcVar4;
        if ((char)local_cc != '\0') {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"IMPORTED_IMPLIB","");
          std::__cxx11::string::_M_append((char *)&local_c8,(ulong)(suffix->_M_dataplus)._M_p);
          pcVar4 = GetProperty(this,&local_c8);
          *local_d8 = pcVar4;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
            operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        pcVar4 = *loc;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_88);
    }
    bVar1 = true;
    if ((*loc == (char *)0x0) && (*local_d8 == (char *)0x0)) {
      bVar1 = this->TargetTypeValue == INTERFACE_LIBRARY;
    }
  }
  else {
    bVar1 = this->TargetTypeValue == INTERFACE_LIBRARY;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,
                    CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                             local_a8.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_68._M_allocated_capacity != &local_58) {
    operator_delete((void *)local_68._M_allocated_capacity,CONCAT71(uStack_57,local_58) + 1);
  }
  return bVar1;
}

Assistant:

bool cmTarget::GetMappedConfig(std::string const& desired_config,
                               const char** loc, const char** imp,
                               std::string& suffix) const
{
  std::string config_upper;
  if (!desired_config.empty()) {
    config_upper = cmSystemTools::UpperCase(desired_config);
  }

  std::string locPropBase;
  if (this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    locPropBase = "IMPORTED_LIBNAME";
  } else if (this->GetType() == cmStateEnums::OBJECT_LIBRARY) {
    locPropBase = "IMPORTED_OBJECTS";
  } else {
    locPropBase = "IMPORTED_LOCATION";
  }

  // Track the configuration-specific property suffix.
  suffix = "_";
  suffix += config_upper;

  std::vector<std::string> mappedConfigs;
  {
    std::string mapProp = "MAP_IMPORTED_CONFIG_";
    mapProp += config_upper;
    if (const char* mapValue = this->GetProperty(mapProp)) {
      cmSystemTools::ExpandListArgument(mapValue, mappedConfigs, true);
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // On a DLL platform there may be only IMPORTED_IMPLIB for a shared
  // library or an executable with exports.
  bool allowImp = this->HasImportLibrary();

  // If a mapping was found, check its configurations.
  for (std::vector<std::string>::const_iterator mci = mappedConfigs.begin();
       !*loc && !*imp && mci != mappedConfigs.end(); ++mci) {
    // Look for this configuration.
    if (mci->empty()) {
      // An empty string in the mapping has a special meaning:
      // look up the config-less properties.
      *loc = this->GetProperty(locPropBase);
      if (allowImp) {
        *imp = this->GetProperty("IMPORTED_IMPLIB");
      }
      // If it was found, set the suffix.
      if (*loc || *imp) {
        suffix.clear();
      }
    } else {
      std::string mcUpper = cmSystemTools::UpperCase(*mci);
      std::string locProp = locPropBase + "_";
      locProp += mcUpper;
      *loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = "IMPORTED_IMPLIB_";
        impProp += mcUpper;
        *imp = this->GetProperty(impProp);
      }

      // If it was found, use it for all properties below.
      if (*loc || *imp) {
        suffix = "_";
        suffix += mcUpper;
      }
    }
  }

  // If we needed to find one of the mapped configurations but did not
  // then the target location is not found.  The project does not want
  // any other configuration.
  if (!mappedConfigs.empty() && !*loc && !*imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave *loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  // If we have not yet found it then there are no mapped
  // configurations.  Look for an exact-match.
  if (!*loc && !*imp) {
    std::string locProp = locPropBase;
    locProp += suffix;
    *loc = this->GetProperty(locProp);
    if (allowImp) {
      std::string impProp = "IMPORTED_IMPLIB";
      impProp += suffix;
      *imp = this->GetProperty(impProp);
    }
  }

  // If we have not yet found it then there are no mapped
  // configurations and no exact match.
  if (!*loc && !*imp) {
    // The suffix computed above is not useful.
    suffix.clear();

    // Look for a configuration-less location.  This may be set by
    // manually-written code.
    *loc = this->GetProperty(locPropBase);
    if (allowImp) {
      *imp = this->GetProperty("IMPORTED_IMPLIB");
    }
  }

  // If we have not yet found it then the project is willing to try
  // any available configuration.
  if (!*loc && !*imp) {
    std::vector<std::string> availableConfigs;
    if (const char* iconfigs = this->GetProperty("IMPORTED_CONFIGURATIONS")) {
      cmSystemTools::ExpandListArgument(iconfigs, availableConfigs);
    }
    for (std::vector<std::string>::const_iterator aci =
           availableConfigs.begin();
         !*loc && !*imp && aci != availableConfigs.end(); ++aci) {
      suffix = "_";
      suffix += cmSystemTools::UpperCase(*aci);
      std::string locProp = locPropBase;
      locProp += suffix;
      *loc = this->GetProperty(locProp);
      if (allowImp) {
        std::string impProp = "IMPORTED_IMPLIB";
        impProp += suffix;
        *imp = this->GetProperty(impProp);
      }
    }
  }
  // If we have not yet found it then the target location is not available.
  if (!*loc && !*imp) {
    // Interface libraries are always available because their
    // library name is optional so it is okay to leave *loc empty.
    return this->GetType() == cmStateEnums::INTERFACE_LIBRARY;
  }

  return true;
}